

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InsertSort.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  int i;
  long lVar2;
  int j;
  long lVar3;
  int sort [10];
  uint local_38 [10];
  
  local_38[4] = 7;
  local_38[5] = 2;
  local_38[6] = 6;
  local_38[7] = 4;
  local_38[0] = 3;
  local_38[1] = 5;
  local_38[2] = 1;
  local_38[3] = 8;
  local_38[8] = 9;
  local_38[9] = 0;
  lVar2 = 1;
  do {
    lVar3 = 0;
    do {
      uVar1 = local_38[lVar2];
      if ((int)uVar1 < (int)local_38[lVar3]) {
        local_38[lVar2] = local_38[lVar3];
        local_38[lVar3] = uVar1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10);
  lVar2 = 0;
  do {
    printf("%d",(ulong)local_38[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10);
  return 0;
}

Assistant:

int main(){
    int i,sort[10] = {3,5,1,8,7,2,6,4,9,0};
    InsertSort(sort,10);
    for (i = 0; i < 10; ++i) {
        printf("%d",sort[i]);
    }
    return 0;
}